

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O1

int envy_bios_parse_bit_A(envy_bios *bios,envy_bios_bit_entry *bit)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  (bios->dacload).bit = bit;
  uVar1 = bit->t_len;
  if (uVar1 < 3) {
    fprintf(_stderr,"Analog load table too short: %d < %d\n",(ulong)uVar1,3);
    iVar5 = -0x16;
  }
  else {
    if (uVar1 != 3) {
      fprintf(_stderr,"Analog load table longer than expected: %d > %d\n",(ulong)uVar1,3);
    }
    if ((bios->dacload).valid == '\0') {
      lVar4 = (ulong)bit->t_offset + 1;
      if ((uint)lVar4 < bios->length) {
        (bios->dacload).offset = CONCAT11(bios->data[lVar4],bios->data[bit->t_offset]);
        iVar3 = 0;
      }
      else {
        (bios->dacload).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        iVar3 = -0xe;
      }
      lVar4 = (ulong)bit->t_offset + 2;
      if ((uint)lVar4 < bios->length) {
        (bios->dacload).unk02 = bios->data[lVar4];
        iVar2 = 0;
      }
      else {
        (bios->dacload).unk02 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar2 = -0xe;
      }
      iVar5 = -0xe;
      if (iVar2 == 0 && iVar3 == 0) {
        iVar3 = envy_bios_parse_dacload(bios);
        iVar5 = 0;
        if (iVar3 != 0) {
          envy_bios_parse_bit_A_cold_2();
          iVar5 = 0;
        }
      }
    }
    else {
      envy_bios_parse_bit_A_cold_1();
      iVar5 = -0x11;
    }
  }
  return iVar5;
}

Assistant:

int envy_bios_parse_bit_A (struct envy_bios *bios, struct envy_bios_bit_entry *bit) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	dacload->bit = bit;
	int wantlen = 3;
	if (bit->t_len < wantlen) {
		ENVY_BIOS_ERR("Analog load table too short: %d < %d\n", bit->t_len, wantlen);
		return -EINVAL;
	}
	if (bit->t_len > wantlen)
		ENVY_BIOS_WARN("Analog load table longer than expected: %d > %d\n", bit->t_len, wantlen);
	if (dacload->valid) {
		ENVY_BIOS_ERR("Found BIT analog table, but DACLOAD table already referenced from info table!\n");
		return -EEXIST;
	}
	int err = 0;
	err |= bios_u16(bios, bit->t_offset+0, &dacload->offset);
	err |= bios_u8(bios, bit->t_offset+2, &dacload->unk02);
	if (err)
		return -EFAULT;
	if (envy_bios_parse_dacload(bios))
		ENVY_BIOS_ERR("Failed to parse DACLOAD table at 0x%04x version %d.%d\n", bios->dacload.offset, bios->dacload.version >> 4, bios->dacload.version & 0xf);
	return 0;
}